

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

void dmrC_insert_branch(dmr_C *C,basic_block *bb,instruction *jmp,basic_block *target)

{
  instruction *piVar1;
  undefined1 local_58 [8];
  ptr_list_iter childiter__;
  basic_block *child;
  instruction *old;
  instruction *br;
  basic_block *target_local;
  instruction *jmp_local;
  basic_block *bb_local;
  dmr_C *C_local;
  
  piVar1 = dmrC_delete_last_instruction(&bb->insns);
  if (piVar1 == jmp) {
    dmrC_kill_instruction(C,piVar1);
    piVar1 = alloc_instruction(C,3,0);
    piVar1->bb = bb;
    (piVar1->field_6).field_1.bb_true = target;
    dmrC_add_instruction(C,&bb->insns,piVar1);
    ptrlist_forward_iterator((ptr_list_iter *)local_58,(ptr_list *)bb->children);
    childiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_58);
    br = (instruction *)target;
    while (childiter__._16_8_ != 0) {
      if ((instruction *)childiter__._16_8_ == br) {
        br = (instruction *)0x0;
      }
      else {
        ptrlist_iter_remove((ptr_list_iter *)local_58);
        remove_parent(C,(basic_block *)childiter__._16_8_,bb);
      }
      childiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_58);
    }
    ptrlist_pack((ptr_list **)&bb->children);
    return;
  }
  __assert_fail("old == jmp",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/linearize.c"
                ,0x2bf,
                "void dmrC_insert_branch(struct dmr_C *, struct basic_block *, struct instruction *, struct basic_block *)"
               );
}

Assistant:

void dmrC_insert_branch(struct dmr_C *C, struct basic_block *bb, struct instruction *jmp, struct basic_block *target)
{
	struct instruction *br, *old;
	struct basic_block *child;

	/* Remove the switch */
	old = dmrC_delete_last_instruction(&bb->insns);
	assert(old == jmp);
	dmrC_kill_instruction(C, old);

	br = alloc_instruction(C, OP_BR, 0);
	br->bb = bb;
	br->bb_true = target;
	dmrC_add_instruction(C, &bb->insns, br);

	FOR_EACH_PTR(bb->children, child) {
		if (child == target) {
			target = NULL;	/* Trigger just once */
			continue;
		}
		DELETE_CURRENT_PTR(child);
		remove_parent(C, child, bb);
	} END_FOR_EACH_PTR(child);
	ptrlist_pack((struct ptr_list **)&bb->children);
}